

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::Read(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       *this,TextReader<fmt::Locale> *bound_reader)

{
  NLHeader *pNVar1;
  TextReader<fmt::Locale> *pTVar2;
  byte *loc;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *pNVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  TextReader<fmt::Locale> *pTVar7;
  byte bVar8;
  Type type;
  uint info;
  int iVar9;
  int iVar10;
  int iVar11;
  LogicalExpr LVar12;
  LinearExprHandler linear_expr;
  NumericExpr NVar13;
  bool bVar14;
  StringRef name;
  MutLogicalCon MVar15;
  MutCommonExpr MVar16;
  bool local_59;
  ArgList local_58;
  BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_> local_48;
  TextReader<fmt::Locale> *local_38;
  
  local_59 = bound_reader == (TextReader<fmt::Locale> *)0x0;
  pNVar1 = this->header_;
  this->num_vars_and_exprs_ =
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  local_38 = bound_reader;
  do {
    pTVar2 = this->reader_;
    loc = (byte *)(pTVar2->super_ReaderBase).ptr_;
    (pTVar2->super_ReaderBase).token_ = (char *)loc;
    (pTVar2->super_ReaderBase).ptr_ = (char *)(loc + 1);
    bVar8 = *loc;
    if (0x61 < bVar8) {
      if (bVar8 < 0x6b) {
        if (bVar8 == 0x62) {
          if (local_59 == false) {
            if (local_38 == (TextReader<fmt::Locale> *)0x0) {
              local_48.problem_ = (BasicProblem<mp::BasicProblemParams<int>_> *)0x0;
              local_48.index_ = 0;
              local_48._12_4_ = 0;
              local_58.types_ = 0;
              local_58.field_1.values_ = (Value *)&local_48;
              TextReader<fmt::Locale>::DoReportError
                        (pTVar2,(char *)loc,(CStringRef)0x173479,&local_58);
            }
            pTVar7 = local_38;
            pTVar2 = this->reader_;
            pcVar4 = (local_38->super_ReaderBase).ptr_;
            pcVar5 = (local_38->super_ReaderBase).start_;
            pcVar6 = (local_38->super_ReaderBase).token_;
            (pTVar2->super_ReaderBase).end_ = (local_38->super_ReaderBase).end_;
            (pTVar2->super_ReaderBase).token_ = pcVar6;
            (pTVar2->super_ReaderBase).ptr_ = pcVar4;
            (pTVar2->super_ReaderBase).start_ = pcVar5;
            std::__cxx11::string::_M_assign((string *)&(pTVar2->super_ReaderBase).name_);
            pTVar2->line_ = pTVar7->line_;
            pTVar2->line_start_ = pTVar7->line_start_;
            bVar14 = true;
            local_38 = (TextReader<fmt::Locale> *)0x0;
          }
          else {
            NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
            ::
            ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::VarHandler>
                      ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                        *)this);
            bVar8 = (byte)this->flags_ & 1;
            bVar14 = bVar8 == 0;
            local_59 = (bool)(local_59 & -bVar8);
          }
          goto LAB_0012f2bb;
        }
        if (bVar8 != 100) goto switchD_0012ee00_caseD_44;
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadInitialValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::AlgebraicConHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this);
      }
      else if (bVar8 == 0x6b) {
        ReadColumnSizes<true>(this);
      }
      else if (bVar8 == 0x72) {
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::AlgebraicConHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this);
      }
      else {
        if (bVar8 != 0x78) goto switchD_0012ee00_caseD_44;
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadInitialValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::VarHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this);
      }
      goto LAB_0012f2b9;
    }
    switch(bVar8) {
    case 0x43:
      iVar9 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.
                            num_algebraic_cons);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      pTVar2 = this->reader_;
      pNVar3 = this->handler_;
      pcVar4 = (pTVar2->super_ReaderBase).ptr_;
      (pTVar2->super_ReaderBase).token_ = pcVar4;
      (pTVar2->super_ReaderBase).ptr_ = pcVar4 + 1;
      NVar13 = ReadNumericExpr(this,*pcVar4,true);
      NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnAlgebraicCon
                (pNVar3,iVar9,(NumericExpr)NVar13.super_ExprBase.impl_);
      break;
    case 0x44:
    case 0x45:
    case 0x48:
    case 0x49:
    case 0x4d:
    case 0x4e:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x54:
    case 0x55:
switchD_0012ee00_caseD_44:
      local_48.problem_ = (BasicProblem<mp::BasicProblemParams<int>_> *)0x0;
      local_48.index_ = 0;
      local_48._12_4_ = 0;
      local_58.types_ = 0;
      local_58.field_1.values_ = (Value *)&local_48;
      TextReader<fmt::Locale>::DoReportError(pTVar2,(char *)loc,(CStringRef)0x1734a3,&local_58);
      break;
    case 0x46:
      iVar9 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
      type = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
      if (SYMBOLIC < type) {
        local_48.problem_ = (BasicProblem<mp::BasicProblemParams<int>_> *)0x0;
        local_48.index_ = 0;
        local_48._12_4_ = 0;
        local_58.types_ = 0;
        local_58.field_1.values_ = (Value *)&local_48;
        TextReader<fmt::Locale>::DoReportError
                  (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x173463,
                   &local_58);
      }
      iVar10 = TextReader<fmt::Locale>::ReadInt<int>(this->reader_);
      name = TextReader<fmt::Locale>::ReadName(this->reader_);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      BasicExprFactory<std::allocator<char>_>::DefineFunction
                (&this->handler_->builder_->super_ExprFactory,iVar9,name,iVar10,type);
      goto LAB_0012f191;
    case 0x47:
      NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ObjHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                  *)this);
      break;
    case 0x4a:
      NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::AlgebraicConHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                  *)this);
      break;
    case 0x4b:
      ReadColumnSizes<false>(this);
      break;
    case 0x4c:
      iVar9 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.
                            num_logical_cons);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      pNVar3 = this->handler_;
      LVar12 = ReadLogicalExpr(this);
      MVar15 = BasicProblem<mp::BasicProblemParams<int>_>::logical_con(pNVar3->builder_,iVar9);
      ((MVar15.
        super_BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
        .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_)->
      logical_cons_).
      super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
      ._M_impl.super__Vector_impl_data._M_start
      [MVar15.
       super_BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_].
      super_ExprBase.impl_ = (Impl *)LVar12.super_ExprBase.impl_;
      break;
    case 0x4f:
      iVar9 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_objs);
      iVar10 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      pTVar2 = this->reader_;
      pcVar4 = (pTVar2->super_ReaderBase).ptr_;
      (pTVar2->super_ReaderBase).token_ = pcVar4;
      (pTVar2->super_ReaderBase).ptr_ = pcVar4 + 1;
      NVar13 = ReadNumericExpr(this,*pcVar4,true);
      pNVar3 = this->handler_;
      iVar11 = (*pNVar3->_vptr_NLProblemBuilder[3])(pNVar3);
      if (((char)iVar11 != '\0') ||
         (iVar11 = (*pNVar3->_vptr_NLProblemBuilder[2])(pNVar3), iVar11 + -1 == iVar9)) {
        pNVar3 = this->handler_;
        iVar11 = (*pNVar3->_vptr_NLProblemBuilder[3])(pNVar3);
        if ((char)iVar11 == '\0') {
          iVar9 = 0;
        }
        NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnObj
                  (pNVar3,iVar9,(uint)(iVar10 != 0),(NumericExpr)NVar13.super_ExprBase.impl_);
      }
      goto LAB_0012f191;
    case 0x53:
      info = TextReader<fmt::Locale>::ReadUInt<int>(pTVar2);
      if (7 < (int)info) {
        local_48.problem_ = (BasicProblem<mp::BasicProblemParams<int>_> *)0x0;
        local_48.index_ = 0;
        local_48._12_4_ = 0;
        local_58.types_ = 0;
        local_58.field_1.values_ = (Value *)&local_48;
        TextReader<fmt::Locale>::DoReportError
                  (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x170cb6,
                   &local_58);
      }
      switch(info & 3) {
      case 0:
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::VarHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this,info);
        break;
      case 1:
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ConHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this,info);
        break;
      case 2:
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ObjHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this,info);
        break;
      case 3:
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ProblemHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this,info);
      }
      break;
    case 0x56:
      iVar9 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars,
                       this->num_vars_and_exprs_);
      iVar9 = iVar9 - (this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
      iVar10 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
      iVar11 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      linear_expr = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::
                    BeginCommonExpr(this->handler_,iVar9,iVar10);
      if (iVar10 != 0) {
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::ReadLinearExpr<mp::BasicProblem<mp::BasicProblemParams<int>>::LinearExprBuilder>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this,iVar10,(LinearExprBuilder)linear_expr.expr_);
      }
      pTVar2 = this->reader_;
      pNVar3 = this->handler_;
      pcVar4 = (pTVar2->super_ReaderBase).ptr_;
      (pTVar2->super_ReaderBase).token_ = pcVar4;
      (pTVar2->super_ReaderBase).ptr_ = pcVar4 + 1;
      NVar13 = ReadNumericExpr(this,*pcVar4,false);
      MVar16 = BasicProblem<mp::BasicProblemParams<int>_>::common_expr(pNVar3->builder_,iVar9);
      local_48._0_12_ =
           MVar16.
           super_BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>._0_12_;
      ((MVar16.
        super_BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
        .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_)->
      nonlinear_exprs_).
      super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
      ._M_impl.super__Vector_impl_data._M_start
      [MVar16.
       super_BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_].
      super_ExprBase.impl_ = (Impl *)NVar13.super_ExprBase.impl_;
      BasicProblem<mp::BasicProblemParams<int>_>::MutCommonExpr::set_position
                ((MutCommonExpr *)&local_48,iVar11);
LAB_0012f191:
      bVar14 = true;
      goto LAB_0012f2bb;
    default:
      if ((bVar8 != 0) || ((byte *)(pTVar2->super_ReaderBase).end_ != loc))
      goto switchD_0012ee00_caseD_44;
      if (local_59 != false) {
        local_48.problem_ = (BasicProblem<mp::BasicProblemParams<int>_> *)0x0;
        local_48.index_ = 0;
        local_48._12_4_ = 0;
        local_58.types_ = 0;
        local_58.field_1.values_ = (Value *)&local_48;
        TextReader<fmt::Locale>::DoReportError(pTVar2,(char *)loc,(CStringRef)0x17348f,&local_58);
      }
      bVar14 = false;
      goto LAB_0012f2bb;
    }
LAB_0012f2b9:
    bVar14 = true;
LAB_0012f2bb:
    if (!bVar14) {
      return;
    }
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::Read(Reader *bound_reader) {
  bool read_bounds = bound_reader == 0;
  // TextReader::ReadHeader checks that this doesn't overflow.
  num_vars_and_exprs_ = header_.num_vars +
      header_.num_common_exprs_in_both +
      header_.num_common_exprs_in_cons +
      header_.num_common_exprs_in_objs +
      header_.num_common_exprs_in_single_cons +
      header_.num_common_exprs_in_single_objs;
  for (;;) {
    char c = reader_.ReadChar();
    switch (c) {
    case 'C': {
      // Nonlinear part of an algebraic constraint body.
      int index = ReadUInt(header_.num_algebraic_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnAlgebraicCon(index, ReadNumericExpr(true));
      break;
    }
    case 'L': {
      // Logical constraint expression.
      int index = ReadUInt(header_.num_logical_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnLogicalCon(index, ReadLogicalExpr());
      break;
    }
    case 'O': {
      // Objective type and nonlinear part of an objective expression.
      int index = ReadUInt(header_.num_objs);
      int obj_type = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      NumericExpr expr = ReadNumericExpr(true);
      if (handler_.NeedObj(index))
        handler_.OnObj(handler_.resulting_obj_index(index),
                       obj_type != 0 ? obj::MAX : obj::MIN,
                       expr);
      break;
    }
    case 'V': {
      // Defined variable definition (must precede V, C, L, O segments
      // where used).
      int expr_index = ReadUInt(header_.num_vars, num_vars_and_exprs_);
      expr_index -= header_.num_vars;
      int num_linear_terms = reader_.ReadUInt();
      int position = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      typename Handler::LinearExprHandler
          expr_handler(handler_.BeginCommonExpr(expr_index, num_linear_terms));
      if (num_linear_terms != 0)
        ReadLinearExpr(num_linear_terms, expr_handler);
      handler_.EndCommonExpr(expr_index, ReadNumericExpr(), position);
      break;
    }
    case 'F': {
      // Imported function description.
      int index = ReadUInt(header_.num_funcs);
      int type = reader_.ReadUInt();
      if (type != func::NUMERIC && type != func::SYMBOLIC)
        reader_.ReportError("invalid function type");
      int num_args = reader_.template ReadInt<int>();
      fmt::StringRef name = reader_.ReadName();
      reader_.ReadTillEndOfLine();
      handler_.OnFunction(index, name, num_args, static_cast<func::Type>(type));
      break;
    }
    case 'G':
      // Linear part of an objective expression & gradient sparsity.
      ReadLinearExpr<ObjHandler>();
      break;
    case 'J':
      // Jacobian sparsity & linear terms in constraints.
      ReadLinearExpr<AlgebraicConHandler>();
      break;
    case 'S': {
      // Suffix values.
      int info = reader_.ReadUInt();
      if (info > (internal::SUFFIX_KIND_MASK | suf::FLOAT))
        reader_.ReportError("invalid suffix kind");
      switch (info & internal::SUFFIX_KIND_MASK) {
      case suf::VAR:
        ReadSuffix<VarHandler>(info);
        break;
      case suf::CON:
        ReadSuffix<ConHandler>(info);
        break;
      case suf::OBJ:
        ReadSuffix<ObjHandler>(info);
        break;
      case suf::PROBLEM:
        ReadSuffix<ProblemHandler>(info);
        break;
      }
      break;
    }
    case 'b':
      // Bounds on variables.
      if (read_bounds) {
        ReadBounds<VarHandler>();
        reader_.ptr();
        if ((flags_ & READ_BOUNDS_FIRST) != 0)
          return;
        read_bounds = false;
        break;
      }
      if (!bound_reader)
        reader_.ReportError("duplicate 'b' segment");
      reader_ = *bound_reader;
      bound_reader = 0;
      break;
    case 'r':
      // Bounds on algebraic constraint bodies ("ranges").
      ReadBounds<AlgebraicConHandler>();
      break;
    case 'K':
      // Jacobian sparsity & linear constraint term matrix column sizes
      // (must precede all J segments).
      ReadColumnSizes<false>();
      break;
    case 'k':
      // Jacobian sparsity & linear constraint term matrix cumulative column
      // sizes (must precede all J segments).
      ReadColumnSizes<true>();
      break;
    case 'x':
      // Primal initial guess.
      ReadInitialValues<VarHandler>();
      break;
    case 'd':
      // Dual initial guess.
      ReadInitialValues<AlgebraicConHandler>();
      break;
    case '\0':
      if (reader_.IsEOF()) {
        if (read_bounds)
          reader_.ReportError("segment 'b' missing");
        return;
      }
      // Fall through.
    default:
      reader_.ReportError("invalid segment type");
    }
  }
}